

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawLineCharacter
               (mline_t *lineguy,int lineguylines,double scale,DAngle *angle,AMColor *color,double x
               ,double y)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  mline_t local_98;
  DAngle local_78;
  DAngle local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)lineguylines;
  if (lineguylines < 1) {
    uVar5 = uVar4;
  }
  local_68 = scale;
  dStack_60 = scale;
  local_58 = scale;
  local_48 = x;
  dStack_40 = y;
  for (; uVar5 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
    pdVar1 = (double *)((long)&(lineguy->a).x + uVar4);
    dVar2 = *pdVar1;
    dVar3 = pdVar1[1];
    local_98.a.x = dVar2 * local_68;
    local_98.a.y = dVar3 * dStack_60;
    if ((local_58 == 0.0) && (!NAN(local_58))) {
      local_98.a.x = dVar2;
      local_98.a.y = dVar3;
    }
    dVar2 = angle->Degrees;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      local_70.Degrees = dVar2;
      AM_rotate((double *)&local_98,&local_98.a.y,&local_70);
    }
    local_98.a.x = local_98.a.x + local_48;
    local_98.a.y = local_98.a.y + dStack_40;
    pdVar1 = (double *)((long)&(lineguy->b).x + uVar4);
    dVar2 = *pdVar1;
    dVar3 = pdVar1[1];
    local_98.b.x = dVar2 * local_68;
    local_98.b.y = dVar3 * dStack_60;
    if ((local_58 == 0.0) && (!NAN(local_58))) {
      local_98.b.x = dVar2;
      local_98.b.y = dVar3;
    }
    dVar2 = angle->Degrees;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      local_78.Degrees = dVar2;
      AM_rotate(&local_98.b.x,&local_98.b.y,&local_78);
    }
    local_98.b.x = local_98.b.x + local_48;
    local_98.b.y = local_98.b.y + dStack_40;
    AM_drawMline(&local_98,color);
  }
  return;
}

Assistant:

void
AM_drawLineCharacter
( const mline_t *lineguy,
  int		lineguylines,
  double	scale,
  DAngle	angle,
  const AMColor &color,
  double	x,
  double	y )
{
	int		i;
	mline_t	l;

	for (i=0;i<lineguylines;i++) {
		l.a.x = lineguy[i].a.x;
		l.a.y = lineguy[i].a.y;

		if (scale) {
			l.a.x *= scale;
			l.a.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.a.x, &l.a.y, angle);

		l.a.x += x;
		l.a.y += y;

		l.b.x = lineguy[i].b.x;
		l.b.y = lineguy[i].b.y;

		if (scale) {
			l.b.x *= scale;
			l.b.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.b.x, &l.b.y, angle);

		l.b.x += x;
		l.b.y += y;

		AM_drawMline(&l, color);
	}
}